

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringExtras.cpp
# Opt level: O0

pair<llvm::StringRef,_llvm::StringRef> *
llvm::getToken(pair<llvm::StringRef,_llvm::StringRef> *__return_storage_ptr__,StringRef Source,
              StringRef Delimiters)

{
  size_t *this;
  StringRef Chars;
  unsigned_long *puVar1;
  char *pcVar2;
  StringRef local_108;
  StringRef local_f8;
  size_type local_e8;
  char *pcStack_e0;
  size_type local_d0;
  size_type End;
  char *pcStack_c0;
  size_type local_b8;
  size_type Start;
  StringRef Delimiters_local;
  StringRef Source_local;
  unsigned_long local_88;
  size_type local_80;
  size_t *local_78;
  undefined1 local_70 [16];
  size_type local_60;
  size_type local_58;
  size_t *local_50;
  undefined1 local_48 [16];
  size_t local_38;
  char *local_30;
  undefined1 *local_28;
  unsigned_long local_20;
  char *local_18;
  undefined1 *local_10;
  
  pcStack_c0 = (char *)Delimiters.Length;
  End = (size_type)Delimiters.Data;
  Source_local.Data = (char *)Source.Length;
  Delimiters_local.Length = (size_t)Source.Data;
  this = &Delimiters_local.Length;
  Start = End;
  Delimiters_local.Data = pcStack_c0;
  local_b8 = StringRef::find_first_not_of((StringRef *)this,Delimiters,0);
  local_e8 = Start;
  pcStack_e0 = Delimiters_local.Data;
  Chars.Length = (size_t)Delimiters_local.Data;
  Chars.Data = (char *)Start;
  local_d0 = StringRef::find_first_of((StringRef *)this,Chars,local_b8);
  local_58 = local_b8;
  local_60 = local_d0;
  local_50 = this;
  puVar1 = std::min<unsigned_long>(&local_58,(unsigned_long *)&Source_local);
  local_58 = *puVar1;
  puVar1 = std::max<unsigned_long>(&local_58,&local_60);
  puVar1 = std::min<unsigned_long>(puVar1,(unsigned_long *)&Source_local);
  local_60 = *puVar1;
  local_f8.Data = (char *)(Delimiters_local.Length + local_58);
  local_f8.Length = local_60 - local_58;
  local_28 = local_48;
  local_80 = local_d0;
  local_88 = 0xffffffffffffffff;
  local_78 = this;
  local_38 = local_f8.Length;
  local_30 = local_f8.Data;
  puVar1 = std::min<unsigned_long>(&local_80,(unsigned_long *)&Source_local);
  local_80 = *puVar1;
  pcVar2 = (char *)(Delimiters_local.Length + local_80);
  Source_local.Length = (long)Source_local.Data - local_80;
  puVar1 = std::min<unsigned_long>(&local_88,&Source_local.Length);
  local_108.Length = *puVar1;
  local_10 = local_70;
  local_108.Data = pcVar2;
  local_20 = local_108.Length;
  local_18 = pcVar2;
  std::make_pair<llvm::StringRef,llvm::StringRef>(__return_storage_ptr__,&local_f8,&local_108);
  return __return_storage_ptr__;
}

Assistant:

std::pair<StringRef, StringRef> llvm::getToken(StringRef Source,
                                               StringRef Delimiters) {
  // Figure out where the token starts.
  StringRef::size_type Start = Source.find_first_not_of(Delimiters);

  // Find the next occurrence of the delimiter.
  StringRef::size_type End = Source.find_first_of(Delimiters, Start);

  return std::make_pair(Source.slice(Start, End), Source.substr(End));
}